

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O2

bool netbase_tests::TestSplitHost(string *test,string *host,uint16_t port,bool validPort)

{
  bool bVar1;
  __type_conflict _Var2;
  long in_FS_OFFSET;
  bool bVar3;
  string_view in;
  uint16_t portOut;
  string hostOut;
  uint16_t local_52;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_52 = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  in._M_str = (test->_M_dataplus)._M_p;
  in._M_len = test->_M_string_length;
  bVar1 = SplitHostPort(in,&local_52,&local_50);
  _Var2 = std::operator==(&local_50,host);
  bVar3 = local_52 == port;
  std::__cxx11::string::~string((string *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1 == validPort && (_Var2 && bVar3);
  }
  __stack_chk_fail();
}

Assistant:

bool static TestSplitHost(const std::string& test, const std::string& host, uint16_t port, bool validPort=true)
{
    std::string hostOut;
    uint16_t portOut{0};
    bool validPortOut = SplitHostPort(test, portOut, hostOut);
    return hostOut == host && portOut == port && validPortOut == validPort;
}